

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O3

void __thiscall trento::Proton::Proton(Proton *this)

{
  pointer pNVar1;
  
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_001319a0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (pointer)operator_new(0x38);
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_start = pNVar1;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pNVar1 + 1;
  pNVar1->x_ = 0.0;
  pNVar1->y_ = 0.0;
  pNVar1->z_ = 0.0;
  pNVar1->is_participant_ = false;
  pNVar1->constituents_exist_ = false;
  *(undefined6 *)&pNVar1->field_0x1a = 0;
  pNVar1->is_participant_ = false;
  pNVar1->constituents_exist_ = false;
  *(undefined6 *)&pNVar1->field_0x1a = 0;
  (pNVar1->constituents_).
  super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
  ._M_impl.super__Vector_impl_data._M_start = 0;
  *(pointer *)
   ((long)&(pNVar1->constituents_).
           super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pNVar1->constituents_).
           super__Vector_base<trento::NucleonData::Constituent,_std::allocator<trento::NucleonData::Constituent>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->super_Nucleus).nucleons_.
  super__Vector_base<trento::NucleonData,_std::allocator<trento::NucleonData>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar1 + 1;
  (this->super_Nucleus).offset_ = 0.0;
  (this->super_Nucleus)._vptr_Nucleus = (_func_int **)&PTR__Nucleus_001319d0;
  return;
}

Assistant:

Proton::Proton() : Nucleus(1) {}